

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageDrawRectangleRec(Image *dst,Rectangle rec,Color color)

{
  int iVar1;
  int y;
  int x;
  
  if (((dst->data != (void *)0x0) && (dst->width != 0)) && (dst->height != 0)) {
    if (0 < (int)rec.height) {
      y = (int)rec.y;
      iVar1 = (int)rec.height + y;
      do {
        x = (int)rec.x;
        if (0 < (int)rec.width) {
          do {
            ImageDrawPixel(dst,x,y,color);
            x = x + 1;
          } while (x < (int)rec.width + (int)rec.x);
        }
        y = y + 1;
      } while (y < iVar1);
    }
  }
  return;
}

Assistant:

void ImageDrawRectangleRec(Image *dst, Rectangle rec, Color color)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (dst->width == 0) || (dst->height == 0)) return;

    int sy = (int)rec.y;
    int ey = sy + (int)rec.height;

    int sx = (int)rec.x;
    int ex = sx + (int)rec.width;

    for (int y = sy; y < ey; y++)
    {
        for (int x = sx; x < ex; x++)
        {
            ImageDrawPixel(dst, x, y, color);
        }
    }
}